

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePolicyCommand.cxx
# Opt level: O3

bool __thiscall
cmCMakePolicyCommand::InitialPass
          (cmCMakePolicyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  ostringstream e;
  string local_1b8;
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  _WordT local_178;
  ios_base local_128 [272];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar1 == (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_198._0_8_ = local_198 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,"requires at least one argument.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_198);
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)pbVar1);
    if (iVar3 == 0) {
      bVar2 = HandleSetMode(this,args);
      return bVar2;
    }
    iVar3 = std::__cxx11::string::compare
                      ((char *)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
    if (iVar3 == 0) {
      bVar2 = HandleGetMode(this,args);
      return bVar2;
    }
    iVar3 = std::__cxx11::string::compare
                      ((char *)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
    if (iVar3 == 0) {
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
        local_188._M_allocated_capacity = 0;
        local_188._8_8_ = 0;
        local_198._0_8_ = (_func_int **)0x0;
        local_198._8_8_ = 0;
        local_178 = 0;
        cmMakefile::PushPolicy((this->super_cmCommand).Makefile,false,(PolicyMap *)local_198);
        return true;
      }
      local_198._0_8_ = local_198 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_198,"PUSH may not be given additional arguments.","");
      cmCommand::SetError(&this->super_cmCommand,(string *)local_198);
    }
    else {
      iVar3 = std::__cxx11::string::compare
                        ((char *)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare
                          ((char *)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start);
        if (iVar3 == 0) {
          bVar2 = HandleVersionMode(this,args);
          return bVar2;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start);
        if (iVar3 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_198,"given unknown first argument \"",0x1e);
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_198,(pbVar1->_M_dataplus)._M_p,
                              pbVar1->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_1b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
          std::ios_base::~ios_base(local_128);
          return false;
        }
        bVar2 = HandleGetWarningMode(this,args);
        return bVar2;
      }
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
        cmMakefile::PopPolicy((this->super_cmCommand).Makefile);
        return true;
      }
      local_198._0_8_ = local_198 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_198,"POP may not be given additional arguments.","");
      cmCommand::SetError(&this->super_cmCommand,(string *)local_198);
    }
  }
  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
    operator_delete((void *)local_198._0_8_,local_188._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool cmCMakePolicyCommand::InitialPass(std::vector<std::string> const& args,
                                       cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("requires at least one argument.");
    return false;
  }

  if (args[0] == "SET") {
    return this->HandleSetMode(args);
  }
  if (args[0] == "GET") {
    return this->HandleGetMode(args);
  }
  if (args[0] == "PUSH") {
    if (args.size() > 1) {
      this->SetError("PUSH may not be given additional arguments.");
      return false;
    }
    this->Makefile->PushPolicy();
    return true;
  }
  if (args[0] == "POP") {
    if (args.size() > 1) {
      this->SetError("POP may not be given additional arguments.");
      return false;
    }
    this->Makefile->PopPolicy();
    return true;
  }
  if (args[0] == "VERSION") {
    return this->HandleVersionMode(args);
  }
  if (args[0] == "GET_WARNING") {
    return this->HandleGetWarningMode(args);
  }

  std::ostringstream e;
  e << "given unknown first argument \"" << args[0] << "\"";
  this->SetError(e.str());
  return false;
}